

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

Array<asl::Map<asl::String,_int>::KeyVal> * __thiscall
asl::Array<asl::Map<asl::String,_int>::KeyVal>::insert
          (Array<asl::Map<asl::String,_int>::KeyVal> *this,int k,KeyVal *x)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  undefined8 *puVar5;
  int iVar6;
  anon_union_16_2_78e7fdac_for_String_2 *__src;
  anon_union_16_2_78e7fdac_for_String_2 *__dest;
  int iVar7;
  KeyVal *pKVar8;
  
  pKVar8 = this->_a;
  iVar1 = *(int *)((long)&pKVar8[-1].key.field_2 + 8);
  iVar2 = *(int *)((long)&pKVar8[-1].key.field_2 + 0xc);
  iVar6 = k;
  if (k < 0) {
    iVar6 = iVar1;
  }
  if (iVar1 < iVar2) {
    piVar4 = (int *)((long)&pKVar8[-1].key.field_2 + 8);
LAB_001386a0:
    if (iVar1 - iVar6 != 0 && iVar6 <= iVar1) {
      memmove(pKVar8 + (long)iVar6 + 1,pKVar8 + iVar6,(long)(iVar1 - iVar6) << 5);
      pKVar8 = this->_a;
    }
    iVar2 = (x->key)._len;
    String::alloc(&pKVar8[iVar6].key,iVar2);
    pKVar8[iVar6].key._len = iVar2;
    if (pKVar8[iVar6].key._size == 0) {
      __dest = &pKVar8[iVar6].key.field_2;
    }
    else {
      __dest = (anon_union_16_2_78e7fdac_for_String_2 *)pKVar8[iVar6].key.field_2._str;
    }
    if ((x->key)._size == 0) {
      __src = &(x->key).field_2;
    }
    else {
      __src = (anon_union_16_2_78e7fdac_for_String_2 *)(x->key).field_2._str;
    }
    memcpy(__dest,__src,(long)iVar2 + 1);
    pKVar8[iVar6].value = x->value;
    *piVar4 = iVar1 + 1;
    return this;
  }
  if (iVar1 != 0x7fffffff) {
    dup(this,k);
    iVar3 = this->_a[-1].value;
    iVar7 = 0x7fffffff;
    if (iVar2 < 0x3ffffffe) {
      iVar7 = iVar2 * 2 + 2;
    }
    piVar4 = (int *)realloc((void *)((long)&this->_a[-1].key.field_2 + 8),(long)iVar7 << 5 | 0x10);
    if (piVar4 != (int *)0x0) {
      pKVar8 = (KeyVal *)(piVar4 + 4);
      this->_a = pKVar8;
      piVar4[1] = iVar7;
      piVar4[2] = iVar3;
      goto LAB_001386a0;
    }
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = dup2;
  __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

Array<T>& Array<T>::insert(int k, const T& x)
{
	Data* h = &d();
	int n = h->n;
	int s = h->s;
	if (k < 0)
		k = n;
	if (n < s) {}
	else
	{
		s++;
		if (n == 2147483647)
			ASL_BAD_ALLOC();
		dup();
		int rc = d().rc;
		ASL_RC_FREE();
		int s1 = s < 1073741823 ? 2 * s : 2147483647;
		char* p = (char*)realloc((char*)_a - sizeof(Data), s1 * sizeof(T) + sizeof(Data));
		if(!p)
			ASL_BAD_ALLOC();
		T* b = (T*) ( p + sizeof(Data) );
		_a = b;
		ASL_RC_INIT();
		h = &d();
		h->s=s1;
		h->rc = rc;
	}
	if (k < n) {
		memmove((char*)(_a + k + 1), (char*)(_a + k), (n - k) * sizeof(T));
	}
	asl_construct_copy(_a + k, x);
	h->n = n+1;
	return *this;
}